

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

void __thiscall
glcts::anon_unknown_0::UniformLocTypesMix::~UniformLocTypesMix(UniformLocTypesMix *this)

{
  UniformLocTypesMix *this_local;
  
  ~UniformLocTypesMix(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

virtual long Run()
	{
		//layout (location = 2) uniform float u0;
		//layout (location = 3) uniform vec3  u1;
		//layout (location = 0) uniform uint  u2;
		//layout (location = 1) uniform ivec3 u3;
		//layout (location = 4) uniform mat2  u4;
		//layout (location = 7) uniform mat2  u5;
		//layout (location = 5) uniform mat2  u6;
		//layout (location = 6) uniform mat3  u7;
		std::vector<Uniform> uniforms;
		uniforms.push_back(Uniform(uniformValueGenerator, GL_FLOAT, Loc::C(2)));
		uniforms.push_back(Uniform(uniformValueGenerator, GL_FLOAT_VEC3, Loc::C(3)));
		uniforms.push_back(Uniform(uniformValueGenerator, GL_UNSIGNED_INT, Loc::C(0)));
		uniforms.push_back(Uniform(uniformValueGenerator, GL_INT_VEC3, Loc::C(1)));
		uniforms.push_back(Uniform(uniformValueGenerator, GL_FLOAT_MAT2, Loc::C(4)));
		uniforms.push_back(Uniform(uniformValueGenerator, GL_FLOAT_MAT2, Loc::C(7)));
		uniforms.push_back(Uniform(uniformValueGenerator, GL_FLOAT_MAT2, Loc::C(5)));
		uniforms.push_back(Uniform(uniformValueGenerator, GL_FLOAT_MAT3, Loc::C(6)));
		return doRun(uniforms);
	}